

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

int __thiscall QListModel::remove(QListModel *this,char *__filename)

{
  long lVar1;
  long lVar2;
  QListWidgetItem *pQVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long unaff_R15;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (__filename == (char *)0x0) goto LAB_005855c8;
  lVar2 = (this->items).d.size;
  if (lVar2 == 0) {
LAB_00585574:
    iVar6 = -1;
  }
  else {
    lVar5 = -8;
    do {
      iVar6 = (int)unaff_R15;
      lVar1 = lVar2 * -8 + lVar5;
      if (lVar1 == -8) goto LAB_0058556e;
      unaff_R15 = lVar5 + 8;
      lVar4 = lVar5 + 8;
      lVar5 = unaff_R15;
    } while (*(char **)((long)(this->items).d.ptr + lVar4) != __filename);
    iVar6 = (int)(unaff_R15 >> 3);
LAB_0058556e:
    if (lVar1 == -8) goto LAB_00585574;
  }
  local_38 = 0xffffffffffffffff;
  local_30 = 0;
  uStack_28 = 0;
  QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_38,iVar6);
  pQVar3 = (this->items).d.ptr[iVar6];
  pQVar3->d->theid = -1;
  pQVar3->view = (QListWidget *)0x0;
  QList<QListWidgetItem_*>::removeAt(&this->items,(long)iVar6);
  QAbstractItemModel::endRemoveRows();
LAB_005855c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::remove(QListWidgetItem *item)
{
    if (!item)
        return;
    int row = items.indexOf(item); // ### use index(item) - it's faster
    Q_ASSERT(row != -1);
    beginRemoveRows(QModelIndex(), row, row);
    items.at(row)->d->theid = -1;
    items.at(row)->view = nullptr;
    items.removeAt(row);
    endRemoveRows();
}